

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O3

void printHelpAndExit(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"DistanceCalculator");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ./DistanceCalculator <filename>");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,
                  "Only *.b8.ugrid or *.lb8.ugrid files are supported at this time.");
  exit(0);
}

Assistant:

void printHelpAndExit(){
    std::cout << "DistanceCalculator" << std::endl;
    std::cout << "Usage: ./DistanceCalculator <filename>" << std::endl;
    std::cout << "Only *.b8.ugrid or *.lb8.ugrid files are supported at this time.";
    exit(0);
}